

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

void __thiscall wasm::GenerateDynCalls::doWalkModule(GenerateDynCalls *this,Module *wasm)

{
  bool bVar1;
  reference pHVar2;
  HeapType *type;
  iterator __end2;
  iterator __begin2;
  InsertOrderedSet<wasm::HeapType> *__range2;
  Module *wasm_local;
  GenerateDynCalls *this_local;
  
  Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
              ).
              super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
              .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>,
             wasm);
  __end2 = InsertOrderedSet<wasm::HeapType>::begin(&this->invokeTypes);
  type = (HeapType *)InsertOrderedSet<wasm::HeapType>::end(&this->invokeTypes);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&type);
    if (!bVar1) break;
    pHVar2 = std::_List_iterator<wasm::HeapType>::operator*(&__end2);
    generateDynCallThunk(this,(HeapType)pHVar2->id);
    std::_List_iterator<wasm::HeapType>::operator++(&__end2);
  }
  return;
}

Assistant:

void doWalkModule(Module* wasm) {
    PostWalker<GenerateDynCalls>::doWalkModule(wasm);
    for (auto& type : invokeTypes) {
      generateDynCallThunk(type);
    }
  }